

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_stroke_line(nk_draw_list *list,nk_vec2 a,nk_vec2 b,nk_color col,float thickness)

{
  nk_vec2 pos;
  nk_vec2 pos_00;
  nk_vec2 pos_01;
  undefined4 in_ESI;
  nk_draw_list *in_RDI;
  undefined8 in_XMM0_Qa;
  nk_vec2 nVar1;
  nk_color in_XMM1_Da;
  float in_XMM1_Db;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  nk_draw_list *in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff90;
  float x;
  nk_color in_stack_ffffffffffffff94;
  float fStack_50;
  float local_4c;
  float fStack_38;
  float local_34;
  char cStack_11;
  float local_8;
  float fStack_4;
  
  if ((in_RDI != (nk_draw_list *)0x0) &&
     (cStack_11 = (char)((uint)in_ESI >> 0x18), cStack_11 != '\0')) {
    if (in_RDI->line_AA == NK_ANTI_ALIASING_ON) {
      pos.y = (float)in_stack_ffffffffffffff94;
      pos.x = in_stack_ffffffffffffff90;
      nk_draw_list_path_line_to(in_stack_ffffffffffffff88,pos);
      pos_00.y = (float)in_stack_ffffffffffffff94;
      pos_00.x = in_stack_ffffffffffffff90;
      nk_draw_list_path_line_to(in_stack_ffffffffffffff88,pos_00);
      in_RDI = in_stack_ffffffffffffff88;
      in_XMM1_Da = in_stack_ffffffffffffff94;
    }
    else {
      local_8 = (float)in_XMM0_Qa;
      x = 0.5;
      nVar1 = nk_vec2(0.5,0.5);
      local_34 = nVar1.x;
      in_stack_ffffffffffffff84 = local_8 - local_34;
      fStack_4 = (float)((ulong)in_XMM0_Qa >> 0x20);
      nVar1 = nk_vec2(x,x);
      fStack_38 = nVar1.y;
      nk_vec2(in_stack_ffffffffffffff84,fStack_4 - fStack_38);
      nVar1.y = (float)in_stack_ffffffffffffff94;
      nVar1.x = x;
      nk_draw_list_path_line_to(in_RDI,nVar1);
      nVar1 = nk_vec2(x,x);
      local_4c = nVar1.x;
      local_4c = (float)in_XMM1_Da - local_4c;
      nVar1 = nk_vec2(x,x);
      fStack_50 = nVar1.y;
      nk_vec2(local_4c,in_XMM1_Db - fStack_50);
      pos_01.y = (float)in_XMM1_Da;
      pos_01.x = x;
      nk_draw_list_path_line_to(in_RDI,pos_01);
      in_stack_ffffffffffffff80 = fStack_4;
    }
    nk_draw_list_path_stroke
              (in_RDI,in_XMM1_Da,(nk_draw_list_stroke)in_stack_ffffffffffffff84,
               in_stack_ffffffffffffff80);
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_stroke_line(struct nk_draw_list *list, struct nk_vec2 a,
struct nk_vec2 b, struct nk_color col, float thickness)
{
NK_ASSERT(list);
if (!list || !col.a) return;
if (list->line_AA == NK_ANTI_ALIASING_ON) {
nk_draw_list_path_line_to(list, a);
nk_draw_list_path_line_to(list, b);
} else {
nk_draw_list_path_line_to(list, nk_vec2_sub(a,nk_vec2(0.5f,0.5f)));
nk_draw_list_path_line_to(list, nk_vec2_sub(b,nk_vec2(0.5f,0.5f)));
}
nk_draw_list_path_stroke(list,  col, NK_STROKE_OPEN, thickness);
}